

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_object.c
# Opt level: O1

void basiclu_obj_free(basiclu_object *obj)

{
  if (obj != (basiclu_object *)0x0) {
    if (obj->istore != (lu_int *)0x0) {
      free(obj->istore);
    }
    obj->istore = (lu_int *)0x0;
    if (obj->xstore != (double *)0x0) {
      free(obj->xstore);
    }
    obj->xstore = (double *)0x0;
    if (obj->Li != (lu_int *)0x0) {
      free(obj->Li);
    }
    obj->Li = (lu_int *)0x0;
    if (obj->Lx != (double *)0x0) {
      free(obj->Lx);
    }
    obj->Lx = (double *)0x0;
    if (obj->Ui != (lu_int *)0x0) {
      free(obj->Ui);
    }
    obj->Ui = (lu_int *)0x0;
    if (obj->Ux != (double *)0x0) {
      free(obj->Ux);
    }
    obj->Ux = (double *)0x0;
    if (obj->Wi != (lu_int *)0x0) {
      free(obj->Wi);
    }
    obj->Wi = (lu_int *)0x0;
    if (obj->Wx != (double *)0x0) {
      free(obj->Wx);
    }
    obj->Wx = (double *)0x0;
    if (obj->lhs != (double *)0x0) {
      free(obj->lhs);
    }
    obj->lhs = (double *)0x0;
    if (obj->ilhs != (lu_int *)0x0) {
      free(obj->ilhs);
    }
    obj->ilhs = (lu_int *)0x0;
    obj->nzlhs = -1;
  }
  return;
}

Assistant:

void basiclu_obj_free(struct basiclu_object *obj)
{
    if (obj)
    {
        obj->istore = lu_free(obj->istore);
        obj->xstore = lu_free(obj->xstore);
        obj->Li = lu_free(obj->Li);
        obj->Lx = lu_free(obj->Lx);
        obj->Ui = lu_free(obj->Ui);
        obj->Ux = lu_free(obj->Ux);
        obj->Wi = lu_free(obj->Wi);
        obj->Wx = lu_free(obj->Wx);
        obj->lhs = lu_free(obj->lhs);
        obj->ilhs = lu_free(obj->ilhs);
        obj->nzlhs = -1;
    }
}